

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O1

void __thiscall
syntax_gtest_tests::syntax_tests::iu_GTestSyntaxTest_x_iutest_x_ExceptionValueEQ_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_ExceptionValueEQ_Test *this)

{
  undefined4 *puVar1;
  int x;
  AssertionResult iutest_ar;
  AssertionResult ar;
  
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 1;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

TEST(GTestSyntaxTest, ExceptionValueEQ)
{
    if( int x = 1 )
        ASSERT_THROW_VALUE_EQ(throw 1, int, x) << x;
    if( int x = 1 )
        EXPECT_THROW_VALUE_EQ(throw 1, int, x) << x;
    if( int x = 1 )
        INFORM_THROW_VALUE_EQ(throw 1, int, x) << x;
    if( int x = 1 )
        ASSUME_THROW_VALUE_EQ(throw 1, int, x) << x;
}